

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O0

int get_layer_order(vector<int,_std::allocator<int>_> *layers,
                   map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                   *layer_info)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  iterator __last;
  pointer ppVar5;
  reference piVar6;
  _Self local_60;
  _Self local_58;
  iterator ldf_iter;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  iterator layer_it;
  map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
  *layer_info_local;
  vector<int,_std::allocator<int>_> *layers_local;
  
  layer_it._M_current = (int *)layer_info;
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(layers);
  while( true ) {
    local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(layers);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    iVar4 = layer_it;
    if (!bVar2) break;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    pmVar3 = std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::operator[]((map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                           *)iVar4._M_current,piVar6);
    iVar1 = pmVar3->order;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    *piVar6 = iVar1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20,0);
  }
  iVar4 = std::vector<int,_std::allocator<int>_>::begin(layers);
  __last = std::vector<int,_std::allocator<int>_>::end(layers);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(layers);
  while( true ) {
    ldf_iter._M_node = (_Base_ptr)std::vector<int,_std::allocator<int>_>::end(layers);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &ldf_iter);
    if (!bVar2) break;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>::
         begin((map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                *)layer_it._M_current);
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::
           map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
           ::end((map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                  *)layer_it._M_current);
      bVar2 = std::operator!=(&local_58,&local_60);
      if (!bVar2) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_58);
      iVar1 = (ppVar5->second).order;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_20);
      if (iVar1 == *piVar6) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_58);
        iVar1 = ppVar5->first;
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_20);
        *piVar6 = iVar1;
        local_58._M_node =
             (_Base_ptr)
             std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::end((map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                    *)layer_it._M_current);
      }
      else {
        std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator++(&local_58,0);
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20,0);
  }
  return 0;
}

Assistant:

int get_layer_order(vector<int> &layers, map<int, layer_data> &layer_info)
{
  // Translate layer numbers to order
  auto layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // int order = layer_info[*layer_it].order;
    *layer_it = layer_info[*layer_it].order;
    layer_it++;
  }
  sort(layers.begin(), layers.end());
  // Translate back to layer
  layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // search through map for matching order
    auto ldf_iter = layer_info.begin();
    while (ldf_iter != layer_info.end())
    {
      if (ldf_iter->second.order == *layer_it)
      {
        *layer_it = ldf_iter->first;
        ldf_iter = layer_info.end();
      }
      else
      {
        ldf_iter++;
      }
    }
    layer_it++;
  }
  return EXIT_SUCCESS;
}